

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyDebugInfoForm
          (DWARFVerifier *this,DWARFDie *Die,DWARFAttribute *AttrValue)

{
  DWARFFormValue *this_00;
  Form FVar1;
  DWARFObject *pDVar2;
  DWARFUnit *this_01;
  DIDumpOptions DumpOpts;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint64_t uVar6;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_02;
  _func_int **pp_Var7;
  undefined4 extraout_var;
  raw_ostream *prVar8;
  undefined **__n;
  size_t sVar9;
  void *__buf;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  format_object_base *__v;
  char *pcVar10;
  undefined1 in_R8B;
  uint Encoding;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef SVar11;
  Optional<unsigned_long> OVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  format_object_base local_80;
  ulong local_70;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_68;
  Optional<unsigned_long> RefVal;
  Optional<unsigned_long> RefVal_1;
  
  FVar1 = (AttrValue->Value).Form;
  Encoding = (uint)FVar1;
  uVar5 = 0;
  if (0x1a < FVar1 - 0xe) {
    return 0;
  }
  pDVar2 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  this_01 = Die->U;
  this_00 = &AttrValue->Value;
  switch((uint)FVar1) {
  case 0xe:
    OVar12 = DWARFFormValue::getAsSectionOffset(this_00);
    if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("SecOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x249,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
    if (OVar12.Storage.field_0.value < extraout_RDX_00) {
      return 0;
    }
    __n = (undefined **)0x0;
    prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    Str_04.Length = 0x2e;
    Str_04.Data = "DW_FORM_strp offset beyond .debug_str bounds:\n";
    raw_ostream::operator<<(prVar8,Str_04);
    prVar8 = this->OS;
    uVar15._0_1_ = (this->DumpOpts).ShowChildren;
    uVar15._1_1_ = (this->DumpOpts).ShowParents;
    uVar15._2_1_ = (this->DumpOpts).ShowForm;
    uVar15._3_1_ = (this->DumpOpts).SummarizeTypes;
    uVar15._4_1_ = (this->DumpOpts).Verbose;
    uVar15._5_1_ = (this->DumpOpts).DisplayRawContents;
    uVar15._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
    uVar13._0_4_ = (this->DumpOpts).DumpType;
    uVar13._4_4_ = (this->DumpOpts).ChildRecurseDepth;
    uVar14._0_4_ = (this->DumpOpts).ParentRecurseDepth;
    uVar14._4_2_ = (this->DumpOpts).Version;
    uVar14._6_1_ = (this->DumpOpts).AddrSize;
    uVar14._7_1_ = (this->DumpOpts).ShowAddresses;
    break;
  default:
    goto switchD_00b09ffa_caseD_f;
  case 0x10:
    OVar12 = DWARFFormValue::getAsReference(this_00);
    RefVal.Storage._8_8_ = OVar12.Storage.field_0;
    if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("RefVal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x238,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    if ((ulong)RefVal.Storage._8_8_ < (this_01->InfoSection->Data).Length) {
      this_02 = &std::
                 map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[](&this->ReferenceToDIEOffsets,
                              (key_type_conflict *)&RefVal.Storage.hasVal)->_M_t;
      pp_Var7 = (_func_int **)DWARFDie::getOffset(Die);
      __v = &local_80;
LAB_00b0a052:
      __v->_vptr_format_object_base = pp_Var7;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_insert_unique<unsigned_long>(this_02,(unsigned_long *)__v);
      return 0;
    }
    __n = (undefined **)0x0;
    prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    Str_05.Length = 0x33;
    Str_05.Data = "DW_FORM_ref_addr offset beyond .debug_info bounds:\n";
    raw_ostream::operator<<(prVar8,Str_05);
    goto LAB_00b0a254;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    OVar12 = DWARFFormValue::getAsReference(this_00);
    local_68 = OVar12.Storage.field_0;
    RefVal.Storage.field_0.empty = OVar12.Storage.hasVal;
    if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("RefVal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                    ,0x220,
                    "unsigned int llvm::DWARFVerifier::verifyDebugInfoForm(const DWARFDie &, DWARFAttribute &)"
                   );
    }
    uVar6 = DWARFUnitHeader::getNextUnitOffset(&this_01->Header);
    local_70 = uVar6 - (this_01->Header).Offset;
    if ((AttrValue->Value).Value.field_0.uval < local_70) {
      this_02 = &std::
                 map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[](&this->ReferenceToDIEOffsets,&local_68.value)->_M_t;
      pp_Var7 = (_func_int **)DWARFDie::getOffset(Die);
      __v = (format_object_base *)&RefVal.Storage.hasVal;
      goto LAB_00b0a052;
    }
    __n = (undefined **)0x0;
    prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    SVar11 = dwarf::FormEncodingString(Encoding);
    prVar8 = raw_ostream::operator<<(prVar8,SVar11);
    Str_01.Length = 0xb;
    Str_01.Data = " CU offset ";
    prVar8 = raw_ostream::operator<<(prVar8,Str_01);
    RefVal.Storage._8_8_ = &PTR_home_00d77818;
    prVar8 = raw_ostream::operator<<(prVar8,(format_object_base *)&RefVal.Storage.hasVal);
    Str_02.Length = 0x2a;
    Str_02.Data = " is invalid (must be less than CU size of ";
    prVar8 = raw_ostream::operator<<(prVar8,Str_02);
    local_80.Fmt = "0x%08lx";
    local_80._vptr_format_object_base = (_func_int **)&PTR_home_00d77818;
    prVar8 = raw_ostream::operator<<(prVar8,&local_80);
    Str_03.Length = 3;
    Str_03.Data = "):\n";
    raw_ostream::operator<<(prVar8,Str_03);
    DWARFDie::dump(Die,this->OS,0,this->DumpOpts);
LAB_00b0a254:
    prVar8 = this->OS;
    uVar15._0_1_ = (this->DumpOpts).ShowChildren;
    uVar15._1_1_ = (this->DumpOpts).ShowParents;
    uVar15._2_1_ = (this->DumpOpts).ShowForm;
    uVar15._3_1_ = (this->DumpOpts).SummarizeTypes;
    uVar15._4_1_ = (this->DumpOpts).Verbose;
    uVar15._5_1_ = (this->DumpOpts).DisplayRawContents;
    uVar15._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
    uVar13._0_4_ = (this->DumpOpts).DumpType;
    uVar13._4_4_ = (this->DumpOpts).ChildRecurseDepth;
    uVar14._0_4_ = (this->DumpOpts).ParentRecurseDepth;
    uVar14._4_2_ = (this->DumpOpts).Version;
    uVar14._6_1_ = (this->DumpOpts).AddrSize;
    uVar14._7_1_ = (this->DumpOpts).ShowAddresses;
    break;
  case 0x1a:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    if ((this_01->StringOffsetsTableContribution).Storage.hasVal == false) {
      __n = (undefined **)0x0;
      prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                                (bool)in_R8B);
      SVar11 = dwarf::FormEncodingString(Encoding);
      prVar8 = raw_ostream::operator<<(prVar8,SVar11);
      pcVar10 = " used without a valid string offsets table:\n";
      sVar9 = 0x2c;
    }
    else {
      __n = (undefined **)(AttrValue->Value).Value.field_0.uval;
      bVar3 = DWARFUnit::getDwarfStringOffsetsByteSize(this_01);
      if ((this_01->StringOffsetsTableContribution).Storage.hasVal == false) {
        __assert_fail("StringOffsetsTableContribution",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                      ,0x155,"uint64_t llvm::DWARFUnit::getStringOffsetsBase() const");
      }
      uVar6 = (this_01->StringOffsetsTableContribution).Storage.field_0.value.Base;
      iVar4 = (*pDVar2->_vptr_DWARFObject[0x19])(pDVar2);
      if (*(ulong *)(CONCAT44(extraout_var,iVar4) + 8) < ((long)__n + 1U) * (ulong)bVar3 + uVar6) {
        prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        SVar11 = dwarf::FormEncodingString(Encoding);
        prVar8 = raw_ostream::operator<<(prVar8,SVar11);
        Str.Length = 0xc;
        Str.Data = " uses index ";
        prVar8 = raw_ostream::operator<<(prVar8,Str);
        RefVal.Storage._8_8_ = &PTR_home_00d77818;
        prVar8 = raw_ostream::operator<<(prVar8,(format_object_base *)&RefVal.Storage.hasVal);
        pcVar10 = ", which is too large:\n";
        sVar9 = 0x16;
      }
      else {
        OVar12 = DWARFUnit::getStringOffsetSectionItem(this_01,(uint32_t)__n);
        if (((undefined1  [16])OVar12.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("hasVal",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                        ,0xad,
                        "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                       );
        }
        (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
        if (OVar12.Storage.field_0.value < extraout_RDX) {
          return 0;
        }
        prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        SVar11 = dwarf::FormEncodingString(Encoding);
        prVar8 = raw_ostream::operator<<(prVar8,SVar11);
        SVar11.Length = 0xc;
        SVar11.Data = " uses index ";
        prVar8 = raw_ostream::operator<<(prVar8,SVar11);
        __n = &PTR_home_00d77818;
        RefVal.Storage._8_8_ = &PTR_home_00d77818;
        prVar8 = raw_ostream::operator<<(prVar8,(format_object_base *)&RefVal.Storage.hasVal);
        pcVar10 = ", but the referenced string offset is beyond .debug_str bounds:\n";
        sVar9 = 0x40;
      }
    }
    Str_00.Length = sVar9;
    Str_00.Data = pcVar10;
    raw_ostream::operator<<(prVar8,Str_00);
    prVar8 = this->OS;
    uVar15._0_1_ = (this->DumpOpts).ShowChildren;
    uVar15._1_1_ = (this->DumpOpts).ShowParents;
    uVar15._2_1_ = (this->DumpOpts).ShowForm;
    uVar15._3_1_ = (this->DumpOpts).SummarizeTypes;
    uVar15._4_1_ = (this->DumpOpts).Verbose;
    uVar15._5_1_ = (this->DumpOpts).DisplayRawContents;
    uVar15._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
    uVar13._0_4_ = (this->DumpOpts).DumpType;
    uVar13._4_4_ = (this->DumpOpts).ChildRecurseDepth;
    uVar14._0_4_ = (this->DumpOpts).ParentRecurseDepth;
    uVar14._4_2_ = (this->DumpOpts).Version;
    uVar14._6_1_ = (this->DumpOpts).AddrSize;
    uVar14._7_1_ = (this->DumpOpts).ShowAddresses;
  }
  DumpOpts.ParentRecurseDepth = (int)uVar14;
  DumpOpts.Version = (short)((ulong)uVar14 >> 0x20);
  DumpOpts.AddrSize = (char)((ulong)uVar14 >> 0x30);
  DumpOpts.ShowAddresses = (bool)(char)((ulong)uVar14 >> 0x38);
  DumpOpts.DumpType = (int)uVar13;
  DumpOpts.ChildRecurseDepth = (int)((ulong)uVar13 >> 0x20);
  DumpOpts.ShowChildren = (bool)(char)uVar15;
  DumpOpts.ShowParents = (bool)(char)((ulong)uVar15 >> 8);
  DumpOpts.ShowForm = (bool)(char)((ulong)uVar15 >> 0x10);
  DumpOpts.SummarizeTypes = (bool)(char)((ulong)uVar15 >> 0x18);
  DumpOpts.Verbose = (bool)(char)((ulong)uVar15 >> 0x20);
  DumpOpts.DisplayRawContents = (bool)(char)((ulong)uVar15 >> 0x28);
  DumpOpts._22_2_ = (short)((ulong)uVar15 >> 0x30);
  DWARFDie::dump(Die,prVar8,0,DumpOpts);
  prVar8 = this->OS;
  pcVar10 = prVar8->OutBufCur;
  if (pcVar10 < prVar8->OutBufEnd) {
    prVar8->OutBufCur = pcVar10 + 1;
    *pcVar10 = '\n';
  }
  else {
    raw_ostream::write(prVar8,10,__buf,(size_t)__n);
  }
  uVar5 = 1;
switchD_00b09ffa_caseD_f:
  return uVar5;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoForm(const DWARFDie &Die,
                                            DWARFAttribute &AttrValue) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  auto DieCU = Die.getDwarfUnit();
  unsigned NumErrors = 0;
  const auto Form = AttrValue.Value.getForm();
  switch (Form) {
  case DW_FORM_ref1:
  case DW_FORM_ref2:
  case DW_FORM_ref4:
  case DW_FORM_ref8:
  case DW_FORM_ref_udata: {
    // Verify all CU relative references are valid CU offsets.
    Optional<uint64_t> RefVal = AttrValue.Value.getAsReference();
    assert(RefVal);
    if (RefVal) {
      auto CUSize = DieCU->getNextUnitOffset() - DieCU->getOffset();
      auto CUOffset = AttrValue.Value.getRawUValue();
      if (CUOffset >= CUSize) {
        ++NumErrors;
        error() << FormEncodingString(Form) << " CU offset "
                << format("0x%08" PRIx64, CUOffset)
                << " is invalid (must be less than CU size of "
                << format("0x%08" PRIx64, CUSize) << "):\n";
        Die.dump(OS, 0, DumpOpts);
        dump(Die) << '\n';
      } else {
        // Valid reference, but we will verify it points to an actual
        // DIE later.
        ReferenceToDIEOffsets[*RefVal].insert(Die.getOffset());
      }
    }
    break;
  }
  case DW_FORM_ref_addr: {
    // Verify all absolute DIE references have valid offsets in the
    // .debug_info section.
    Optional<uint64_t> RefVal = AttrValue.Value.getAsReference();
    assert(RefVal);
    if (RefVal) {
      if (*RefVal >= DieCU->getInfoSection().Data.size()) {
        ++NumErrors;
        error() << "DW_FORM_ref_addr offset beyond .debug_info "
                   "bounds:\n";
        dump(Die) << '\n';
      } else {
        // Valid reference, but we will verify it points to an actual
        // DIE later.
        ReferenceToDIEOffsets[*RefVal].insert(Die.getOffset());
      }
    }
    break;
  }
  case DW_FORM_strp: {
    auto SecOffset = AttrValue.Value.getAsSectionOffset();
    assert(SecOffset); // DW_FORM_strp is a section offset.
    if (SecOffset && *SecOffset >= DObj.getStrSection().size()) {
      ++NumErrors;
      error() << "DW_FORM_strp offset beyond .debug_str bounds:\n";
      dump(Die) << '\n';
    }
    break;
  }
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4: {
    auto Index = AttrValue.Value.getRawUValue();
    auto DieCU = Die.getDwarfUnit();
    // Check that we have a valid DWARF v5 string offsets table.
    if (!DieCU->getStringOffsetsTableContribution()) {
      ++NumErrors;
      error() << FormEncodingString(Form)
              << " used without a valid string offsets table:\n";
      dump(Die) << '\n';
      break;
    }
    // Check that the index is within the bounds of the section.
    unsigned ItemSize = DieCU->getDwarfStringOffsetsByteSize();
    // Use a 64-bit type to calculate the offset to guard against overflow.
    uint64_t Offset =
        (uint64_t)DieCU->getStringOffsetsBase() + Index * ItemSize;
    if (DObj.getStrOffsetsSection().Data.size() < Offset + ItemSize) {
      ++NumErrors;
      error() << FormEncodingString(Form) << " uses index "
              << format("%" PRIu64, Index) << ", which is too large:\n";
      dump(Die) << '\n';
      break;
    }
    // Check that the string offset is valid.
    uint64_t StringOffset = *DieCU->getStringOffsetSectionItem(Index);
    if (StringOffset >= DObj.getStrSection().size()) {
      ++NumErrors;
      error() << FormEncodingString(Form) << " uses index "
              << format("%" PRIu64, Index)
              << ", but the referenced string"
                 " offset is beyond .debug_str bounds:\n";
      dump(Die) << '\n';
    }
    break;
  }
  default:
    break;
  }
  return NumErrors;
}